

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts3EvalNearTrim(int nNear,char *aTmp,char **paPoslist,int *pnToken,Fts3Phrase *pPhrase)

{
  byte *pbVar1;
  byte *pbVar2;
  char *pcVar3;
  bool bVar4;
  Fts3Phrase *pFVar5;
  byte bVar6;
  byte bVar7;
  int iVar8;
  long lVar9;
  size_t sVar10;
  int iVar11;
  char *pcVar12;
  byte *pbVar13;
  char *pOut;
  char *p2;
  char *pTmp2;
  char *pTmp1;
  char *local_70;
  byte *local_68;
  char *local_60;
  Fts3Phrase *local_58;
  int *local_50;
  char *local_48;
  byte *local_40;
  byte *local_38;
  
  iVar11 = *pnToken;
  pcVar3 = (pPhrase->doclist).pList;
  pcVar12 = *paPoslist;
  local_70 = pcVar3;
  local_60 = aTmp;
  local_58 = pPhrase;
  local_50 = pnToken;
  local_48 = pcVar3;
  local_38 = (byte *)aTmp;
  fts3PoslistPhraseMerge((char **)&local_38,pPhrase->nToken + nNear,0,0,paPoslist,&local_48);
  pbVar1 = local_38;
  local_40 = local_38;
  local_68 = local_38;
  *paPoslist = pcVar12;
  local_48 = pcVar3;
  fts3PoslistPhraseMerge((char **)&local_40,nNear + iVar11,1,0,&local_48,paPoslist);
  if (local_40 == pbVar1 || pbVar1 == (byte *)aTmp) {
    if (pbVar1 == (byte *)aTmp) {
      if (local_40 == pbVar1) {
        iVar11 = 0;
        bVar4 = true;
        goto LAB_001d54ec;
      }
      bVar6 = *pbVar1;
      pbVar13 = pbVar1;
      if (bVar6 != 0) {
        do {
          pbVar2 = pbVar13 + 1;
          pbVar13 = pbVar13 + 1;
          bVar7 = bVar6 & 0x80;
          bVar6 = *pbVar2;
        } while (bVar7 != 0 || *pbVar2 != 0);
      }
      sVar10 = (size_t)((int)(pbVar13 + 1) - (int)pbVar1);
      memcpy(pcVar3,pbVar1,sVar10);
      local_70 = pcVar3 + sVar10;
      local_68 = pbVar13 + 1;
    }
    else {
      bVar6 = *aTmp;
      pcVar12 = aTmp;
      if (bVar6 != 0) {
        do {
          pbVar1 = (byte *)(pcVar12 + 1);
          pcVar12 = pcVar12 + 1;
          bVar7 = bVar6 & 0x80;
          bVar6 = *pbVar1;
        } while (bVar7 != 0 || *pbVar1 != 0);
      }
      sVar10 = (size_t)((int)(pcVar12 + 1) - (int)aTmp);
      memcpy(pcVar3,aTmp,sVar10);
      local_70 = pcVar3 + sVar10;
      local_60 = pcVar12 + 1;
    }
  }
  else {
    fts3PoslistMerge(&local_70,&local_60,(char **)&local_68);
  }
  bVar4 = false;
  iVar11 = 1;
LAB_001d54ec:
  pFVar5 = local_58;
  if (!bVar4) {
    pcVar3 = (local_58->doclist).pList;
    lVar9 = (long)((int)local_70 - (int)pcVar3) + -1;
    iVar8 = (int)lVar9;
    memset(pcVar3 + iVar8,0,(local_58->doclist).nList - lVar9);
    (pFVar5->doclist).nList = iVar8;
    *paPoslist = (pFVar5->doclist).pList;
    *local_50 = pFVar5->nToken;
  }
  return iVar11;
}

Assistant:

static int fts3EvalNearTrim(
  int nNear,                      /* NEAR distance. As in "NEAR/nNear". */
  char *aTmp,                     /* Temporary space to use */
  char **paPoslist,               /* IN/OUT: Position list */
  int *pnToken,                   /* IN/OUT: Tokens in phrase of *paPoslist */
  Fts3Phrase *pPhrase             /* The phrase object to trim the doclist of */
){
  int nParam1 = nNear + pPhrase->nToken;
  int nParam2 = nNear + *pnToken;
  int nNew;
  char *p2; 
  char *pOut; 
  int res;

  assert( pPhrase->doclist.pList );

  p2 = pOut = pPhrase->doclist.pList;
  res = fts3PoslistNearMerge(
    &pOut, aTmp, nParam1, nParam2, paPoslist, &p2
  );
  if( res ){
    nNew = (int)(pOut - pPhrase->doclist.pList) - 1;
    assert( pPhrase->doclist.pList[nNew]=='\0' );
    assert( nNew<=pPhrase->doclist.nList && nNew>0 );
    memset(&pPhrase->doclist.pList[nNew], 0, pPhrase->doclist.nList - nNew);
    pPhrase->doclist.nList = nNew;
    *paPoslist = pPhrase->doclist.pList;
    *pnToken = pPhrase->nToken;
  }

  return res;
}